

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_function.hpp
# Opt level: O2

void duckdb::AggregateFunction::
     StateInitialize<duckdb::AvgState<duckdb::hugeint_t>,duckdb::HugeintAverageOperation,(duckdb::AggregateDestructorType)0>
               (AggregateFunction *param_1,data_ptr_t state)

{
  BaseSumOperation<duckdb::AverageSetOperation,duckdb::HugeintAdd>::
  Initialize<duckdb::AvgState<duckdb::hugeint_t>>((AvgState<duckdb::hugeint_t> *)state);
  return;
}

Assistant:

static void StateInitialize(const AggregateFunction &, data_ptr_t state) {
		// FIXME: we should remove the "destructor_type" option in the future
#if !defined(__GNUC__) || (__GNUC__ >= 5)
		static_assert(std::is_trivially_move_constructible<STATE>::value ||
		                  destructor_type == AggregateDestructorType::LEGACY,
		              "Aggregate state must be trivially move constructible");
#endif
		OP::Initialize(*reinterpret_cast<STATE *>(state));
	}